

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mojoshader.c
# Opt level: O0

void state_texm3x3(Context *ctx,char *opcode,int dims)

{
  int iVar1;
  RegisterList *pRVar2;
  uint local_30;
  TextureType ttype;
  RegisterList *sreg;
  int dims_local;
  char *opcode_local;
  Context *ctx_local;
  
  iVar1 = shader_version_atleast(ctx,'\x01','\x04');
  if (iVar1 != 0) {
    failf(ctx,"%s opcode not available after Shader Model 1.3",opcode);
  }
  if (ctx->texm3x3pad_dst1 == -1) {
    failf(ctx,"%s opcode without matching TEXM3X3PADs",opcode);
  }
  state_texops(ctx,opcode,dims,0);
  ctx->reset_texmpad = 1;
  pRVar2 = reglist_find(&ctx->samplers,REG_TYPE_SAMPLER,(ctx->dest_arg).regnum);
  if (pRVar2 == (RegisterList *)0x0) {
    local_30 = 0;
  }
  else {
    local_30 = pRVar2->index;
  }
  if ((local_30 != 4) && (local_30 != 3)) {
    failf(ctx,"%s needs a 3D or Cubemap sampler",opcode);
  }
  return;
}

Assistant:

static void state_texm3x3(Context *ctx, const char *opcode, const int dims)
{
    // !!! FIXME: check for correct opcode existance and order more rigorously?
    if (shader_version_atleast(ctx, 1, 4))
        failf(ctx, "%s opcode not available after Shader Model 1.3", opcode);
    if (ctx->texm3x3pad_dst1 == -1)
        failf(ctx, "%s opcode without matching TEXM3X3PADs", opcode);
    state_texops(ctx, opcode, dims, 0);
    ctx->reset_texmpad = 1;

    RegisterList *sreg = reglist_find(&ctx->samplers, REG_TYPE_SAMPLER,
                                      ctx->dest_arg.regnum);
    const TextureType ttype = (TextureType) (sreg ? sreg->index : 0);

    // A samplermap might change this to something nonsensical.
    if ((ttype != TEXTURE_TYPE_VOLUME) && (ttype != TEXTURE_TYPE_CUBE))
        failf(ctx, "%s needs a 3D or Cubemap sampler", opcode);
}